

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O3

void __thiscall
cfd::api::json::DecodeRawTransactionResponse::DecodeRawTransactionResponse
          (DecodeRawTransactionResponse *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::api::json::DecodeRawTransactionResponse>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodeRawTransactionResponse_0072f1e0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->txid_)._M_dataplus._M_p = (pointer)&(this->txid_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->txid_,"");
  (this->hash_)._M_dataplus._M_p = (pointer)&(this->hash_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->hash_,"");
  (this->vin_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxIn>.
  super_vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
  .
  super__Vector_base<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vin_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxIn>.
  super_vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
  .
  super__Vector_base<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vin_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxIn>.
  super_vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
  .
  super__Vector_base<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->version_ = 0;
  this->size_ = 0;
  this->vsize_ = 0;
  this->weight_ = 0;
  this->locktime_ = 0;
  (this->vin_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxIn>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_0072f278;
  (this->vout_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxOut>.
  super_vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
  .
  super__Vector_base<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vout_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxOut>.
  super_vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
  .
  super__Vector_base<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vout_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxOut>.
  super_vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
  .
  super__Vector_base<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vout_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxOut>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_0072f508;
  CollectFieldName();
  return;
}

Assistant:

DecodeRawTransactionResponse() {
    CollectFieldName();
  }